

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwen2vl-cli.cpp
# Opt level: O1

bool eval_tokens(llama_context *ctx_llama,vector<int,_std::allocator<int>_> *tokens,int n_batch,
                int *n_past,int *st_pos_id)

{
  pointer piVar1;
  undefined1 uVar2;
  undefined1 extraout_AL;
  int iVar3;
  int *piVar4;
  common_log *log;
  int *extraout_RAX;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  vector<int,_std::allocator<int>_> pos;
  llama_batch batch;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  vector<int,_std::allocator<int>_> local_a8;
  int *local_90;
  int *local_88;
  ulong local_80;
  long local_78;
  llama_context *local_70;
  uint local_68 [4];
  undefined4 local_58;
  pointer piStack_50;
  undefined4 local_48;
  undefined4 uStack_40;
  undefined8 local_38;
  
  piVar4 = (int *)((ulong)((long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_90 = piVar4;
  local_88 = n_past;
  local_70 = ctx_llama;
  if (0 < (int)(uint)piVar4) {
    local_78 = (long)n_batch;
    local_80 = (ulong)((uint)piVar4 & 0x7fffffff);
    uVar7 = 0;
    do {
      piVar1 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = (int)((ulong)((long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar1) >> 2) -
              (int)uVar7;
      if (n_batch <= iVar8) {
        iVar8 = n_batch;
      }
      llama_batch_get_one(local_68,piVar1 + uVar7,iVar8);
      std::vector<int,_std::allocator<int>_>::resize(&local_a8,(long)(int)local_68[0] << 2);
      piVar1 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        memset(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,0,
               ((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                (-4 - (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
      }
      uVar6 = (ulong)local_68[0];
      if (0 < (int)local_68[0]) {
        uVar5 = 0;
        do {
          piVar1[uVar5] =
               (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                    (long)(int)uVar6) + *st_pos_id;
          uVar5 = uVar5 + 1;
          uVar6 = (ulong)(int)local_68[0];
        } while ((long)uVar5 < (long)(uVar6 * 3));
      }
      piStack_50 = piVar1;
      piStack_50._0_4_ = SUB84(piVar1,0);
      uVar9 = local_58;
      uVar10 = piStack_50._0_4_;
      uVar11 = local_48;
      uVar12 = uStack_40;
      uVar13 = local_38;
      piStack_50 = piVar1;
      iVar3 = llama_decode(local_70);
      if (iVar3 == 0) {
        *local_88 = *local_88 + iVar8;
        *st_pos_id = *st_pos_id + iVar8;
        piVar4 = local_88;
      }
      else {
        piVar4 = &common_log_verbosity_thold;
        if (-1 < common_log_verbosity_thold) {
          log = common_log_main();
          common_log_add(log,GGML_LOG_LEVEL_ERROR,
                         "%s : failed to eval. token %d/%d (batch size %d, n_past %d)\n",
                         "eval_tokens",uVar7 & 0xffffffff,local_90,n_batch,*local_88,uVar9,uVar10,
                         uVar11,uVar12,uVar13);
          piVar4 = extraout_RAX;
        }
      }
    } while ((iVar3 == 0) && (uVar7 = uVar7 + local_78, (long)uVar7 < (long)local_80));
  }
  uVar2 = SUB81(piVar4,0);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar2 = extraout_AL;
  }
  return (bool)uVar2;
}

Assistant:

static bool eval_tokens(struct llama_context * ctx_llama, std::vector<llama_token> tokens, int n_batch, int * n_past, int * st_pos_id) {
    int N = (int) tokens.size();
    std::vector<llama_pos> pos;
    for (int i = 0; i < N; i += n_batch) {
        int n_eval = (int) tokens.size() - i;
        if (n_eval > n_batch) {
            n_eval = n_batch;
        }
        auto batch = llama_batch_get_one(&tokens[i], n_eval);
        // TODO: add mrope pos ids somewhere else
        pos.resize(batch.n_tokens * 4);
        std::fill(pos.begin(), pos.end(), 0);
        for (int j = 0; j < batch.n_tokens * 3; j ++) {
            pos[j] = *st_pos_id + (j % batch.n_tokens);
        }
        batch.pos = pos.data();

        if (llama_decode(ctx_llama, batch)) {
            LOG_ERR("%s : failed to eval. token %d/%d (batch size %d, n_past %d)\n", __func__, i, N, n_batch, *n_past);
            return false;
        }
        *n_past += n_eval;
        *st_pos_id += n_eval;
    }
    return true;
}